

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log.c
# Opt level: O2

void ly_log_location(lysc_node *scnode,lyd_node *dnode,char *path,ly_in *in)

{
  long lVar1;
  char *object;
  ly_set *set;
  
  if (scnode != (lysc_node *)0x0) {
    lVar1 = __tls_get_addr(&PTR_001fcfa0);
    ly_set_add((ly_set *)(lVar1 + 0x10),scnode,'\x01',(uint32_t *)0x0);
  }
  if ((dnode != (lyd_node *)0x0) ||
     (((scnode == (lysc_node *)0x0 && (path == (char *)0x0)) && (in == (ly_in *)0x0)))) {
    lVar1 = __tls_get_addr(&PTR_001fcfa0);
    ly_set_add((ly_set *)(lVar1 + 0x20),dnode,'\x01',(uint32_t *)0x0);
  }
  if (path == (char *)0x0) {
    if (in == (ly_in *)0x0) {
      return;
    }
    set = (ly_set *)__tls_get_addr(&PTR_001fcfa0);
  }
  else {
    object = strdup(path);
    if (object == (char *)0x0) {
      ly_log((ly_ctx *)0x0,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","ly_log_location");
      return;
    }
    set = (ly_set *)__tls_get_addr(&PTR_001fcfa0);
    ly_set_add(set + 3,object,'\x01',(uint32_t *)0x0);
    if (in == (ly_in *)0x0) {
      return;
    }
  }
  ly_set_add(set,in,'\x01',(uint32_t *)0x0);
  return;
}

Assistant:

void
ly_log_location(const struct lysc_node *scnode, const struct lyd_node *dnode, const char *path, const struct ly_in *in)
{
    if (scnode) {
        ly_set_add(&log_location.scnodes, (void *)scnode, 1, NULL);
    }
    if (dnode || (!scnode && !path && !in)) {
        ly_set_add(&log_location.dnodes, (void *)dnode, 1, NULL);
    }
    if (path) {
        char *s = strdup(path);

        LY_CHECK_ERR_RET(!s, LOGMEM(NULL), );
        ly_set_add(&log_location.paths, s, 1, NULL);
    }
    if (in) {
        ly_set_add(&log_location.inputs, (void *)in, 1, NULL);
    }
}